

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Softmax_x86_fma::forward_inplace(Softmax_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  uint uVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  ulong local_e8;
  Mat local_d8;
  long local_90;
  ulong local_88;
  Mat *local_80;
  long local_78;
  ulong local_70;
  undefined8 local_68;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  long local_48;
  Option *local_40;
  uint local_38;
  uint local_34;
  
  uVar16 = bottom_top_blob->dims;
  local_50 = (ulong)uVar16;
  uVar14 = bottom_top_blob->w;
  uVar20 = (ulong)uVar14;
  uVar19 = (ulong)(uint)bottom_top_blob->h;
  local_58 = (ulong)(uint)bottom_top_blob->d;
  local_88 = (ulong)(uint)bottom_top_blob->c;
  lVar17 = (long)bottom_top_blob->elempack;
  iVar15 = (this->super_Softmax).axis;
  local_80 = bottom_top_blob;
  local_40 = opt;
  if (uVar16 == 1) {
    softmax((float *)bottom_top_blob->data,bottom_top_blob->elempack * uVar14,1);
  }
  uVar16 = (iVar15 >> 0x1f & uVar16) + iVar15;
  local_90 = lVar17;
  local_70 = uVar19;
  if (((int)local_50 == 2) && (uVar16 == 0)) {
    iVar15 = local_40->num_threads;
    iVar6 = (int)(uVar14 + iVar15 + -1) / iVar15;
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    Mat::create(&local_d8,iVar6,2,iVar15,4,local_40->workspace_allocator);
    bVar21 = (long)local_d8.c * local_d8.cstep == 0;
    if (local_d8.data != (void *)0x0 && !bVar21) {
      local_68 = CONCAT71(local_68._1_7_,local_d8.data == (void *)0x0 || bVar21);
      if (0 < (int)((long)(int)uVar14 / (long)iVar6)) {
        iVar15 = (int)local_90;
        local_78 = (long)iVar6;
        uVar18 = (long)(int)uVar14 / (long)iVar6 & 0xffffffff;
        local_48 = local_90 * local_78 * 4;
        lVar17 = 0;
        uVar19 = uVar20;
        do {
          iVar7 = get_omp_thread_num();
          iVar12 = (int)uVar19;
          iVar8 = iVar12;
          if (iVar6 <= iVar12) {
            iVar8 = iVar6;
          }
          pfVar11 = (float *)((long)iVar7 * local_d8.cstep *
                              CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
                             (long)local_d8.data);
          softmax((float *)((long)local_80->data + lVar17),(int)local_70,(int)local_90,
                  iVar15 * uVar14,iVar8,pfVar11,pfVar11 + local_78);
          lVar17 = lVar17 + local_48;
          uVar19 = (ulong)(uint)(iVar12 - iVar6);
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      uVar19 = local_70;
      lVar17 = local_90;
      piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      if ((char)local_68 != '\0') {
        return -100;
      }
      goto LAB_0035eb23;
    }
    piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) goto LAB_0035f122;
      if (local_d8.allocator != (Allocator *)0x0) {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
        goto LAB_0035f122;
      }
LAB_0035f115:
      if (local_d8.data != (void *)0x0) {
        free(local_d8.data);
      }
    }
LAB_0035f122:
    iVar15 = -100;
  }
  else {
LAB_0035eb23:
    local_68 = CONCAT44(local_68._4_4_,uVar16) ^ 1;
    if (0 < (int)uVar19 && ((int)local_50 == 2 && uVar16 == 1)) {
      uVar18 = 0;
      do {
        softmax((float *)((long)local_80->w * uVar18 * local_80->elemsize + (long)local_80->data),
                uVar14,(int)lVar17);
        uVar18 = uVar18 + 1;
      } while (uVar19 != uVar18);
    }
    if (((int)local_50 - 3U < 2) && (uVar16 == 0)) {
      iVar6 = (int)uVar19 * uVar14 * (int)local_58;
      iVar15 = local_40->num_threads;
      iVar8 = (iVar15 + iVar6 + -1) / iVar15;
      local_78 = CONCAT44(local_78._4_4_,(int)local_80->cstep * (int)lVar17);
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.allocator = (Allocator *)0x0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      Mat::create(&local_d8,iVar8,2,iVar15,4,local_40->workspace_allocator);
      bVar21 = (long)local_d8.c * local_d8.cstep == 0;
      if (local_d8.data == (void *)0x0 || bVar21) {
        piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) goto LAB_0035f115;
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_0035f122;
      }
      local_5c = CONCAT31(local_5c._1_3_,local_d8.data == (void *)0x0 || bVar21);
      if (0 < (int)((long)iVar6 / (long)iVar8)) {
        local_48 = (long)iVar8;
        uVar19 = (long)iVar6 / (long)iVar8 & 0xffffffff;
        lVar10 = local_90 * local_48;
        lVar17 = 0;
        do {
          iVar7 = get_omp_thread_num();
          iVar15 = iVar6;
          if (iVar8 <= iVar6) {
            iVar15 = iVar8;
          }
          pfVar11 = (float *)((long)iVar7 * local_d8.cstep *
                              CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
                             (long)local_d8.data);
          softmax((float *)((long)local_80->data + lVar17),(int)local_88,(int)local_90,(int)local_78
                  ,iVar15,pfVar11,pfVar11 + local_48);
          lVar17 = lVar17 + lVar10 * 4;
          uVar19 = uVar19 - 1;
          iVar6 = iVar6 - iVar8;
        } while (uVar19 != 0);
      }
      uVar19 = local_70;
      lVar17 = local_90;
      piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      if ((char)local_5c != '\0') {
        return -100;
      }
    }
    local_5c = (uint)local_50 ^ 4;
    uVar13 = (uint)local_50 ^ 3;
    uVar9 = uVar16 ^ 2;
    uVar1 = (uint)local_68 | uVar13;
    local_68 = CONCAT44(local_68._4_4_,uVar1);
    if ((uVar1 == 0) || (local_5c == 0 && uVar9 == 0)) {
      iVar15 = (int)lVar17 * uVar14;
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.allocator = (Allocator *)0x0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      local_78 = CONCAT44(local_78._4_4_,iVar15);
      Mat::create(&local_d8,iVar15,2,local_40->num_threads,4,local_40->workspace_allocator);
      bVar21 = local_d8.data == (void *)0x0;
      bVar22 = (long)local_d8.c * local_d8.cstep == 0;
      local_34 = uVar9;
      if (bVar21 || bVar22) {
        piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) goto LAB_0035f115;
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_0035f122;
      }
      uVar19 = local_70;
      local_68 = uVar20;
      local_38 = uVar13;
      if (0 < (int)local_88) {
        local_48 = (long)(int)local_78;
        local_e8 = 0;
        do {
          if (0 < (int)local_58) {
            uVar20 = 0;
            do {
              iVar15 = local_80->w;
              iVar6 = local_80->h;
              pvVar2 = local_80->data;
              sVar3 = local_80->elemsize;
              sVar4 = local_80->cstep;
              iVar8 = get_omp_thread_num();
              uVar19 = local_70;
              pfVar11 = (float *)((long)iVar8 * local_d8.cstep *
                                  CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
                                 (long)local_d8.data);
              softmax((float *)((long)pvVar2 +
                               (long)iVar6 * sVar3 * (long)iVar15 * uVar20 +
                               sVar4 * local_e8 * sVar3),(int)local_70,1,(int)local_78,(int)local_78
                      ,pfVar11,pfVar11 + local_48);
              uVar20 = uVar20 + 1;
            } while (local_58 != uVar20);
          }
          local_e8 = local_e8 + 1;
        } while (local_e8 != local_88);
      }
      uVar13 = local_38;
      uVar20 = local_68;
      piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      uVar9 = local_34;
      if (bVar21 || bVar22) {
        return -100;
      }
    }
    iVar15 = (int)uVar20;
    if (0 < (int)local_88 && (uVar13 == 0 && uVar9 == 0)) {
      iVar6 = (int)local_90;
      uVar18 = 0;
      do {
        if (0 < (int)uVar19) {
          pfVar11 = (float *)(local_80->cstep * local_80->elemsize * uVar18 + (long)local_80->data);
          uVar19 = local_70 & 0xffffffff;
          do {
            softmax(pfVar11,iVar15,iVar6);
            pfVar11 = pfVar11 + iVar6 * iVar15;
            uVar14 = (int)uVar19 - 1;
            uVar19 = (ulong)uVar14;
          } while (uVar14 != 0);
        }
        uVar18 = uVar18 + 1;
        uVar19 = local_70;
      } while (uVar18 != local_88);
    }
    iVar6 = (int)local_90;
    if (((int)local_50 == 4) && (uVar16 == 1)) {
      iVar15 = iVar6 * iVar15 * (int)uVar19;
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.allocator = (Allocator *)0x0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      Mat::create(&local_d8,iVar15,2,local_40->num_threads,4,local_40->workspace_allocator);
      bVar21 = (long)local_d8.c * local_d8.cstep == 0;
      if (local_d8.data == (void *)0x0 || bVar21) {
        piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) goto LAB_0035f115;
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_0035f122;
      }
      local_78 = CONCAT71(local_78._1_7_,local_d8.data == (void *)0x0 || bVar21);
      local_68 = uVar20;
      if (0 < (int)local_88) {
        uVar19 = 0;
        do {
          pvVar2 = local_80->data;
          sVar3 = local_80->elemsize;
          sVar4 = local_80->cstep;
          iVar6 = get_omp_thread_num();
          pfVar11 = (float *)((long)iVar6 * local_d8.cstep *
                              CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) +
                             (long)local_d8.data);
          softmax((float *)((long)pvVar2 + sVar4 * uVar19 * sVar3),(int)local_58,1,iVar15,iVar15,
                  pfVar11,pfVar11 + iVar15);
          uVar19 = uVar19 + 1;
        } while (local_88 != uVar19);
      }
      uVar20 = local_68;
      piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      iVar6 = (int)local_90;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_d8.cstep = 0;
      local_d8.data = (void *)0x0;
      local_d8.refcount._0_4_ = 0;
      local_d8.refcount._4_4_ = 0;
      local_d8.elemsize._0_4_ = 0;
      local_d8.elemsize._4_4_ = 0;
      local_d8.elempack = 0;
      local_d8.dims = 0;
      local_d8.w = 0;
      local_d8.h = 0;
      local_d8.d = 0;
      local_d8.c = 0;
      if ((char)local_78 != '\0') {
        return -100;
      }
    }
    lVar17 = local_90;
    local_5c = local_5c | uVar16 ^ 3;
    if (0 < (int)local_88 && local_5c == 0) {
      local_e8 = 0;
      do {
        if (0 < (int)local_58) {
          pfVar11 = (float *)(local_80->cstep * local_e8 * local_80->elemsize + (long)local_80->data
                             );
          iVar15 = 0;
          do {
            uVar19 = local_70 & 0xffffffff;
            if (0 < (int)local_70) {
              do {
                softmax(pfVar11,(int)uVar20,(int)lVar17);
                pfVar11 = pfVar11 + iVar6 * (int)uVar20;
                uVar16 = (int)uVar19 - 1;
                uVar19 = (ulong)uVar16;
              } while (uVar16 != 0);
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 != (int)local_58);
        }
        local_e8 = local_e8 + 1;
      } while (local_e8 != local_88);
    }
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int Softmax_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int elempack = bottom_top_blob.elempack;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        const int size = w * elempack;

        softmax(ptr, size, 1);
    }

    if (dims == 2 && positive_axis == 0)
    {
        const int size = w;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = w * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, h, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w, elempack);
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        const int size = w * h * d;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = bottom_top_blob.cstep * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, channels, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        const int size = w * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                float* maxsumptr = maxsum.channel(get_omp_thread_num());
                float* maxptr = maxsumptr;
                float* sumptr = maxptr + size;

                softmax(ptr, h, 1, size, size, maxptr, sumptr);
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w, elempack);
                ptr += w * elempack;
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        const int size = w * h * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + size;

            softmax(ptr, d, 1, size, size, maxptr, sumptr);
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w, elempack);
                    ptr += w * elempack;
                }
            }
        }
    }

    return 0;
}